

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_batch_collector.hpp
# Opt level: O2

void __thiscall duckdb::ArrowBatchGlobalState::~ArrowBatchGlobalState(ArrowBatchGlobalState *this)

{
  BatchCollectorGlobalState::~BatchCollectorGlobalState(&this->super_BatchCollectorGlobalState);
  operator_delete(this);
  return;
}

Assistant:

ArrowBatchGlobalState(ClientContext &context, const PhysicalBatchCollector &op)
	    : BatchCollectorGlobalState(context, op) {
	}